

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coap.cpp
# Opt level: O3

Error * __thiscall
ot::commissioner::coap::Message::Serialize
          (Error *__return_storage_ptr__,Message *this,Header *aHeader,ByteArray *aBuf)

{
  char cVar1;
  undefined1 uVar2;
  byte bVar3;
  char *from;
  char *to;
  iterator iVar4;
  pointer puVar5;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  format_args args;
  writer write;
  writer local_b0;
  format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a8;
  string local_78;
  ErrorCode local_58;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  __return_storage_ptr__->mCode = kNone;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  bVar3 = *(byte *)aHeader;
  if (bVar3 < 0x90 && (bVar3 & 3) == 1) {
    bVar3 = bVar3 >> 4 | bVar3 * '\x04' & 0x30;
    local_a8.types_[0] = CONCAT31(local_a8.types_[0]._1_3_,bVar3) | 0x40;
    iVar4._M_current =
         (aBuf->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar4._M_current ==
        (aBuf->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_realloc_insert<unsigned_char>
                (aBuf,iVar4,(uchar *)&local_a8);
      iVar4._M_current =
           (aBuf->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_finish;
    }
    else {
      *iVar4._M_current = bVar3 | 0x40;
      iVar4._M_current =
           (aBuf->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_finish + 1;
      (aBuf->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
      super__Vector_impl_data._M_finish = iVar4._M_current;
    }
    if (iVar4._M_current ==
        (aBuf->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_char,std::allocator<unsigned_char>>::
      _M_realloc_insert<unsigned_char_const&>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)aBuf,iVar4,&aHeader->mCode);
      iVar4._M_current =
           (aBuf->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_finish;
    }
    else {
      *iVar4._M_current = aHeader->mCode;
      iVar4._M_current =
           (aBuf->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_finish + 1;
      (aBuf->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
      super__Vector_impl_data._M_finish = iVar4._M_current;
    }
    uVar2 = *(uchar *)((long)&aHeader->mMessageId + 1);
    if (iVar4._M_current ==
        (aBuf->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      local_a8.types_[0]._0_1_ = uVar2;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_realloc_insert<unsigned_char>
                (aBuf,iVar4,(uchar *)&local_a8);
      iVar4._M_current =
           (aBuf->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_finish;
    }
    else {
      *iVar4._M_current = uVar2;
      iVar4._M_current =
           (aBuf->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_finish + 1;
      (aBuf->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
      super__Vector_impl_data._M_finish = iVar4._M_current;
    }
    local_a8.types_[0]._0_1_ = (undefined1)aHeader->mMessageId;
    if (iVar4._M_current ==
        (aBuf->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_realloc_insert<unsigned_char>
                (aBuf,iVar4,(uchar *)&local_a8);
      puVar5 = (aBuf->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_finish;
    }
    else {
      *iVar4._M_current = (undefined1)local_a8.types_[0];
      puVar5 = (aBuf->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_finish + 1;
      (aBuf->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
      super__Vector_impl_data._M_finish = puVar5;
    }
    std::vector<unsigned_char,std::allocator<unsigned_char>>::_M_range_insert<unsigned_char_const*>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)aBuf,puVar5,aHeader->mToken,
               aHeader->mToken + (*(byte *)aHeader >> 4));
  }
  else {
    local_a8.types_[0] = none_type;
    from = "serialize an invalid CoAP message header";
    local_a8.context_.super_basic_format_parse_context<char>.format_str_.data_ =
         "serialize an invalid CoAP message header";
    local_a8.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x28;
    local_a8.context_.super_basic_format_parse_context<char>.next_arg_id_ = 0;
    local_a8.context_.super_basic_format_parse_context<char>._20_4_ = 0;
    local_a8.parse_funcs_[0] = (parse_func)0x0;
    local_b0.handler_ = &local_a8;
    local_a8.context_.types_ = local_a8.types_;
    do {
      cVar1 = *from;
      to = from;
      while (cVar1 != '{') {
        to = to + 1;
        if (to == "") {
          ::fmt::v10::detail::
          parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
          operator()(&local_b0,from,"");
          goto LAB_001f20db;
        }
        cVar1 = *to;
      }
      ::fmt::v10::detail::
      parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
      operator()(&local_b0,from,to);
      from = ::fmt::v10::detail::
             parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                       (to,"",&local_a8);
    } while (from != "");
LAB_001f20db:
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)&local_a8;
    ::fmt::v10::vformat_abi_cxx11_
              (&local_78,(v10 *)"serialize an invalid CoAP message header",
               (string_view)ZEXT816(0x28),args);
    local_58 = kInvalidArgs;
    local_50[0] = local_40;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_50,local_78._M_dataplus._M_p,
               local_78._M_dataplus._M_p + local_78._M_string_length);
    __return_storage_ptr__->mCode = local_58;
    std::__cxx11::string::operator=((string *)&__return_storage_ptr__->mMessage,(string *)local_50);
    if (local_50[0] != local_40) {
      operator_delete(local_50[0]);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Error Message::Serialize(const Header &aHeader, ByteArray &aBuf) const
{
    Error error;

    VerifyOrExit(aHeader.IsValid(), error = ERROR_INVALID_ARGS("serialize an invalid CoAP message header"));

    aBuf.push_back((aHeader.mVersion << 6) | (aHeader.mType << 4) | aHeader.mTokenLength);
    aBuf.push_back(aHeader.mCode);
    aBuf.push_back((aHeader.mMessageId & 0xff00) >> 8);
    aBuf.push_back((aHeader.mMessageId & 0x00ff));
    aBuf.insert(aBuf.end(), aHeader.mToken, aHeader.mToken + aHeader.mTokenLength);

exit:
    return error;
}